

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromiseresolver.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseResolver<void>::reject<std::__exception_ptr::exception_ptr>
          (PromiseResolver<void> *this,exception_ptr *error)

{
  QPromise<void> *pQVar1;
  Data *pDVar2;
  PromiseDataBase<void,_void_()> *pPVar3;
  QPromise<void> *promise;
  exception_ptr *error_local;
  PromiseResolver<void> *this_local;
  
  pDVar2 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::operator->
                     (&this->m_d);
  pQVar1 = pDVar2->promise;
  if (pQVar1 != (QPromise<void> *)0x0) {
    pPVar3 = &QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_>::operator->
                        (&(pQVar1->super_QPromiseBase<void>).m_d)->
              super_PromiseDataBase<void,_void_()>;
    PromiseDataBase<void,_void_()>::reject<std::__exception_ptr::exception_ptr>(pPVar3,error);
    pPVar3 = &QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_>::operator->
                        (&(pQVar1->super_QPromiseBase<void>).m_d)->
              super_PromiseDataBase<void,_void_()>;
    PromiseDataBase<void,_void_()>::dispatch(pPVar3);
    release(this);
  }
  return;
}

Assistant:

void reject(E&& error)
    {
        auto promise = m_d->promise;
        if (promise) {
            Q_ASSERT(promise->isPending());
            promise->m_d->reject(std::forward<E>(error));
            promise->m_d->dispatch();
            release();
        }
    }